

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS ref_phys_entropy_flux(REF_DBL *primitive,REF_DBL *flux)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar6 = *primitive;
  dVar1 = primitive[1];
  dVar2 = primitive[2];
  dVar3 = primitive[3];
  dVar5 = primitive[4];
  dVar4 = pow(dVar6,1.4);
  dVar5 = log(dVar5 / dVar4);
  dVar6 = (dVar5 * dVar6) / -0.3999999999999999;
  *flux = dVar1 * dVar6;
  flux[1] = dVar2 * dVar6;
  flux[2] = dVar6 * dVar3;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_entropy_flux(REF_DBL *primitive, REF_DBL *flux) {
  REF_DBL rho, u, v, w, p, s, U;
  REF_DBL gamma = 1.4;

  rho = primitive[0];
  u = primitive[1];
  v = primitive[2];
  w = primitive[3];
  p = primitive[4];

  s = log(p / pow(rho, gamma));
  U = -rho * s / (gamma - 1.0);

  flux[0] = U * u;
  flux[1] = U * v;
  flux[2] = U * w;

  return REF_SUCCESS;
}